

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

void Gia_Sim2InfoRefineEquivs(Gia_Sim2_t *p)

{
  int iVar1;
  Vec_Int_t *vRefined;
  Gia_Obj_t *pGVar2;
  int iVar3;
  long lVar4;
  
  vRefined = Vec_IntAlloc((int)p);
  for (lVar4 = 1; lVar4 < p->pAig->nObjs; lVar4 = lVar4 + 1) {
    iVar3 = (int)lVar4;
    pGVar2 = Gia_ManObj(p->pAig,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    if (((uint)p->pAig->pReprs[lVar4] & 0xfffffff) == 0) {
      iVar1 = Gia_Sim2CompareZero(p->pDataSim + iVar3 * p->nWords,p->nWords,
                                  (uint)((ulong)*(undefined8 *)pGVar2 >> 0x3f));
      if (iVar1 == 0) {
        Vec_IntPush(vRefined,iVar3);
      }
    }
  }
  Gia_Sim2ProcessRefined(p,vRefined);
  free(vRefined->pArray);
  free(vRefined);
  iVar3 = 1;
  while( true ) {
    if (p->pAig->nObjs <= iVar3) break;
    iVar1 = Gia_ObjIsHead(p->pAig,iVar3);
    if (iVar1 != 0) {
      Gia_Sim2ClassRefineOne(p,iVar3);
    }
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void Gia_Sim2InfoRefineEquivs( Gia_Sim2_t * p )
{
    Vec_Int_t * vRefined;
    Gia_Obj_t * pObj;
    unsigned * pSim;
    int i, Count = 0;
    // process constant candidates
    vRefined = Vec_IntAlloc( 100 );
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( !Gia_ObjIsConst(p->pAig, i) )
            continue;
        pSim = Gia_Sim2Data( p, i );
//Extra_PrintBinary( stdout, pSim, 32 * p->nWords );  printf( "\n" );
        if ( !Gia_Sim2CompareZero( pSim, p->nWords, Gia_ObjPhase(pObj) ) )
        {
            Vec_IntPush( vRefined, i );
            Count++;
        }
    }
    Gia_Sim2ProcessRefined( p, vRefined );
    Vec_IntFree( vRefined );
    // process other classes
    Gia_ManForEachClass( p->pAig, i )
        Count += Gia_Sim2ClassRefineOne( p, i );
//    if ( Count )
//        printf( "Refined %d times.\n", Count );
}